

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.h
# Opt level: O3

unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
__thiscall wabt::WastLexer::MakeLineFinder(WastLexer *this)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> this_00;
  LexerSource *local_30;
  _Head_base<0UL,_wabt::LexerSource_*,_false> local_28;
  
  LexerSource::Clone((LexerSource *)&local_30);
  this_00._M_head_impl = (LexerSource *)operator_new(0x30);
  local_28._M_head_impl = local_30;
  local_30 = (LexerSource *)0x0;
  LexerSourceLineFinder::LexerSourceLineFinder
            ((LexerSourceLineFinder *)this_00._M_head_impl,
             (unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *)&local_28);
  (this->source_)._M_t.
  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = this_00._M_head_impl;
  if (local_28._M_head_impl != (LexerSource *)0x0) {
    operator_delete(local_28._M_head_impl,0x18);
  }
  if (local_30 != (LexerSource *)0x0) {
    operator_delete(local_30,0x18);
  }
  return (__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
          )(__uniq_ptr_data<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<LexerSourceLineFinder> MakeLineFinder() {
    return std::make_unique<LexerSourceLineFinder>(source_->Clone());
  }